

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forest_device.cpp
# Opt level: O1

void device_init(char *cfg)

{
  RTCScene scene_i;
  uint i;
  long lVar1;
  undefined8 *puVar2;
  
  lVar1 = 0;
  rtcSetDeviceMemoryMonitorFunction(g_device,embree::monitorMemoryFunction,0);
  _DAT_002e9eb0 = 0;
  embree::data = 0;
  _DAT_002e9e48 = 0;
  DAT_002e9ed0 = 0;
  DAT_002e9ed8 = 0;
  DAT_002e9ee0 = 0;
  DAT_002e9ee8 = 0;
  puVar2 = &embree::scene_trees;
  do {
    scene_i = (RTCScene)rtcNewScene(g_device);
    *puVar2 = scene_i;
    embree::addTree(scene_i,(uint)lVar1);
    rtcCommitScene(*puVar2);
    lVar1 = lVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar1 != 6);
  embree::scene_terrain = (RTCScene)rtcNewScene(g_device);
  embree::addTerrain(embree::scene_terrain);
  rtcCommitScene(embree::scene_terrain);
  return;
}

Assistant:

void device_init (char* cfg)
{
  rtcSetDeviceMemoryMonitorFunction(g_device, monitorMemoryFunction, nullptr);

  TutorialData_Constructor(&data);

  for (unsigned int i = 0; i < 6; ++i) {
    scene_trees[i] = rtcNewScene(g_device);
    addTree(scene_trees[i], i);
    rtcCommitScene(scene_trees[i]);
  }

  /* add ground plane */
  scene_terrain = rtcNewScene(g_device);
  addTerrain(scene_terrain);
  rtcCommitScene(scene_terrain);
}